

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 ngram_class_prob(ngram_class_t *lmclass,int32 wid)

{
  int iVar1;
  ngram_hash_s *pnVar2;
  int32 *piVar3;
  uint uVar4;
  
  uVar4 = wid & 0xffffff;
  iVar1 = lmclass->start_wid;
  if ((iVar1 <= (int)uVar4) && ((int)uVar4 <= iVar1 + lmclass->n_words)) {
    piVar3 = lmclass->prob1 + (int)(uVar4 - iVar1);
LAB_001053db:
    return *piVar3;
  }
  uVar4 = lmclass->n_hash - 1U & wid;
  if (uVar4 != 0xffffffff) {
    pnVar2 = lmclass->nword_hash;
    do {
      if (pnVar2[(int)uVar4].wid == wid) {
        piVar3 = &pnVar2[(int)uVar4].prob1;
        goto LAB_001053db;
      }
      uVar4 = pnVar2[(int)uVar4].next;
    } while (uVar4 != 0xffffffff);
  }
  return 1;
}

Assistant:

int32
ngram_class_prob(ngram_class_t * lmclass, int32 wid)
{
    int32 base_wid = NGRAM_BASEWID(wid);

    if (base_wid < lmclass->start_wid
        || base_wid > lmclass->start_wid + lmclass->n_words) {
        int32 hash;

        /* Look it up in the hash table. */
        hash = wid & (lmclass->n_hash - 1);
        while (hash != -1 && lmclass->nword_hash[hash].wid != wid)
            hash = lmclass->nword_hash[hash].next;
        if (hash == -1)
            return 1;
        return lmclass->nword_hash[hash].prob1;
    }
    else {
        return lmclass->prob1[base_wid - lmclass->start_wid];
    }
}